

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::double_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,double_writer *f)

{
  byte bVar1;
  ulong uVar2;
  char __tmp;
  ulong n;
  size_t __len;
  size_t __n;
  size_t __len_1;
  type pcVar3;
  type local_30;
  
  n = (ulong)spec->width_;
  uVar2 = (f->buffer->size_ + 1) - (ulong)(f->sign == '\0');
  __n = n - uVar2;
  if (n < uVar2 || __n == 0) {
    local_30 = internal::reserve<std::__cxx11::string>
                         ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this,uVar2);
    double_writer::operator()((double_writer *)f,&local_30);
  }
  else {
    local_30 = internal::reserve<std::__cxx11::string>
                         ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this,n);
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar2 = __n >> 1;
      pcVar3 = local_30;
      if (1 < __n) {
        pcVar3 = local_30 + uVar2;
        memset(local_30,(uint)bVar1,uVar2);
      }
      local_30 = pcVar3;
      double_writer::operator()((double_writer *)f,&local_30);
      __n = __n - uVar2;
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pcVar3 = local_30 + __n;
        memset(local_30,(uint)bVar1,__n);
        local_30 = pcVar3;
        double_writer::operator()((double_writer *)f,&local_30);
        return;
      }
      double_writer::operator()((double_writer *)f,&local_30);
    }
    memset(local_30,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }